

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

intptr_t sysbvm_dictionary_scanFor
                   (sysbvm_context_t *context,sysbvm_dictionary_t **dictionary,
                   sysbvm_tuple_t *element)

{
  _Bool _Var1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  anon_struct_16_2_ceb630cf gcFrame;
  ulong local_58;
  long lStack_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&local_58;
  local_58 = 0;
  lStack_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  sysbvm_stackFrame_pushRecord(&local_48);
  uVar3 = (*dictionary)->storage;
  uVar5 = 0xffffffffffffffff;
  if (((uVar3 & 0xf) == 0 && uVar3 != 0) && (7 < *(uint *)(uVar3 + 0xc))) {
    uVar4 = (ulong)(*(uint *)(uVar3 + 0xc) >> 3);
    local_58 = uVar3;
    sVar2 = sysbvm_tuple_hash(context,*element);
    uVar3 = sVar2 % uVar4;
    uVar5 = uVar3;
    do {
      lStack_50 = *(long *)(local_58 + 0x10 + uVar5 * 8);
      if ((lStack_50 == 0) ||
         (_Var1 = sysbvm_tuple_equals(context,*element,*(sysbvm_tuple_t *)(lStack_50 + 0x10)), _Var1
         )) goto LAB_0010990c;
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
    uVar4 = 0xffffffffffffffff;
    if (uVar3 != 0) {
      uVar5 = 0;
      do {
        lStack_50 = *(long *)(local_58 + 0x10 + uVar5 * 8);
        if ((lStack_50 == 0) ||
           (_Var1 = sysbvm_tuple_equals(context,*element,*(sysbvm_tuple_t *)(lStack_50 + 0x10)),
           _Var1)) goto LAB_0010990c;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar3);
    }
  }
  else {
LAB_0010990c:
    uVar4 = uVar5;
    sysbvm_stackFrame_popRecord(&local_48);
  }
  return uVar4;
}

Assistant:

static intptr_t sysbvm_dictionary_scanFor(sysbvm_context_t *context, sysbvm_dictionary_t **dictionary, sysbvm_tuple_t *element)
{
    struct {
        sysbvm_array_t *storage;
        sysbvm_association_t *association;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t capacity = sysbvm_tuple_getSizeInSlots((*dictionary)->storage);
    if(capacity == 0)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return -1;
    }

    gcFrame.storage = (sysbvm_array_t*)(*dictionary)->storage;
    size_t hashIndex = sysbvm_tuple_hash(context, *element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        gcFrame.association = (sysbvm_association_t*)gcFrame.storage->elements[i];
        if(!gcFrame.association ||
            sysbvm_tuple_equals(context, *element, gcFrame.association->key))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (intptr_t)i;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        gcFrame.association = (sysbvm_association_t*)gcFrame.storage->elements[i];
        if(!gcFrame.association ||
            sysbvm_tuple_equals(context, *element, gcFrame.association->key))
        {
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return (intptr_t)i;
        }
    }

    return -1;
}